

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrSat.c
# Opt level: O3

void Pdr_ManSetPropertyOutput(Pdr_Man_t *p,int k)

{
  sat_solver *s;
  Vec_Ptr_t *pVVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  undefined8 in_RAX;
  Aig_Man_t *pAVar4;
  long lVar5;
  int Lit;
  undefined8 uStack_38;
  
  if (p->pPars->fUsePropOut != 0) {
    uStack_38 = in_RAX;
    if ((k < 0) || (p->vSolvers->nSize <= k)) {
LAB_005fbaf0:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    s = (sat_solver *)p->vSolvers->pArray[(uint)k];
    pAVar4 = p->pAig;
    if (0 < pAVar4->nTruePos) {
      lVar5 = 0;
      do {
        if (pAVar4->vCos->nSize <= lVar5) goto LAB_005fbaf0;
        pVVar1 = p->vCexes;
        if (pVVar1 == (Vec_Ptr_t *)0x0) {
LAB_005fba58:
          pVVar2 = p->pPars->vOutMap;
          if (pVVar2 != (Vec_Int_t *)0x0) {
            if (pVVar2->nSize <= lVar5) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (pVVar2->pArray[lVar5] == -1) goto LAB_005fbab7;
          }
          iVar3 = Pdr_ObjSatVar(p,k,1,(Aig_Obj_t *)pAVar4->vCos->pArray[lVar5]);
          if (iVar3 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x12e,"int Abc_Var2Lit(int, int)");
          }
          uStack_38 = CONCAT44(iVar3 * 2 + 1,(undefined4)uStack_38);
          iVar3 = sat_solver_addclause
                            (s,(lit *)((long)&uStack_38 + 4),(lit *)&stack0xffffffffffffffd0);
          if (iVar3 != 1) {
            __assert_fail("RetValue == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrSat.c"
                          ,0xc5,"void Pdr_ManSetPropertyOutput(Pdr_Man_t *, int)");
          }
          pAVar4 = p->pAig;
        }
        else {
          if (pVVar1->nSize <= lVar5) goto LAB_005fbaf0;
          if (pVVar1->pArray[lVar5] == (void *)0x0) goto LAB_005fba58;
        }
LAB_005fbab7:
        lVar5 = lVar5 + 1;
      } while (lVar5 < pAVar4->nTruePos);
    }
    if (s->qtail != s->qhead) {
      iVar3 = sat_solver_simplify(s);
      if (iVar3 == 0) {
        __assert_fail("RetValue != 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0x102,"void sat_solver_compress(sat_solver *)");
      }
    }
  }
  return;
}

Assistant:

void Pdr_ManSetPropertyOutput( Pdr_Man_t * p, int k )
{
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int Lit, RetValue, i;
    if ( !p->pPars->fUsePropOut )
        return;
    pSat = Pdr_ManSolver(p, k);
    Saig_ManForEachPo( p->pAig, pObj, i )
    {
        // skip solved outputs
        if ( p->vCexes && Vec_PtrEntry(p->vCexes, i) )
            continue;
        // skip timedout outputs
        if ( p->pPars->vOutMap && Vec_IntEntry(p->pPars->vOutMap, i) == -1 )
            continue;
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, k, 1, pObj), 1 ); // neg literal
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue == 1 );
    }
    sat_solver_compress( pSat );
}